

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O2

FX * make_FXcopy(FX *fx68k)

{
  DLword *source68k;
  undefined2 uVar1;
  uint uVar2;
  bool bVar3;
  DLword DVar4;
  DLword DVar5;
  ushort uVar6;
  LispPTR LVar7;
  DLword *dest68k;
  LispPTR *pLVar8;
  FX *pFVar9;
  int nw;
  StackWord *start68k;
  FX *SAddr;
  
  uVar6 = fx68k->nextblock;
  LVar7 = LAddrFromNative(fx68k);
  nw = ((uint)uVar6 - (LVar7 & 0xffff)) + 2;
  DVar5 = (DLword)nw;
  if (((fx68k->field_0x3 & 2) == 0) || (*(short *)((long)&fx68k->nametable + 2) != 1)) {
    dest68k = freestackblock(DVar5,(StackWord *)(MachineState.pvar + -10),-1);
    bVar3 = true;
  }
  else {
    start68k = (StackWord *)(MachineState.pvar + -10);
    DVar4 = StackOffsetFromNative(fx68k);
    dest68k = freestackblock(DVar5,start68k,(int)(DVar4 - 2) % 4);
    bVar3 = false;
  }
  if (dest68k == (DLword *)0x0) {
    SAddr = (FX *)0x0;
  }
  else {
    source68k = &fx68k[-1].clink;
    blt(dest68k,source68k,nw);
    *(byte *)((long)dest68k + 3) = *(byte *)((long)dest68k + 3) | 2;
    SAddr = (FX *)(dest68k + 2);
    DVar5 = StackOffsetFromNative(SAddr);
    dest68k[7] = DVar5 + (uVar6 - (short)LVar7);
    if ((fx68k->alink & 1) == 0) {
      LVar7 = LAddrFromNative(source68k);
      DVar5 = (DLword)LVar7;
    }
    else {
      DVar5 = fx68k->blink;
    }
    pLVar8 = NativeAligned4FromStackOffset(DVar5);
    if ((fx68k->alink & 1) == 0) {
      LVar7 = LAddrFromNative(source68k);
      DVar5 = (DLword)LVar7;
    }
    else {
      DVar5 = fx68k->blink;
    }
    dest68k[0xb] = DVar5;
    uVar2 = *(uint *)(dest68k + 2);
    if ((uVar2 & 1) == 0) {
      dest68k[10] = (DLword)uVar2;
      *(uint *)(dest68k + 2) = uVar2 | 1;
    }
    dest68k[3] = (ushort)(uVar2 >> 0x10) & 0xff00;
    if (!bVar3) {
      *(int *)(dest68k + 8) = *(int *)(dest68k + 8) + (int)((ulong)((long)SAddr - (long)fx68k) >> 1)
      ;
    }
    *(char *)((long)pLVar8 + 2) = *(char *)((long)pLVar8 + 2) + '\x01';
    if ((fx68k->alink & 1) == 0) {
      DVar5 = StackOffsetFromNative(source68k);
      fx68k->blink = DVar5;
      fx68k->clink = fx68k->alink;
      *(byte *)&fx68k->alink = (byte)fx68k->alink | 1;
    }
    uVar1 = fx68k->clink;
    pFVar9 = (FX *)NativeAligned4FromStackOffset(uVar1 - 10);
    incusecount68k(pFVar9);
    uVar6 = (ushort)*(uint *)fx68k & 0xfffe;
    if (*(ushort *)((long)&fx68k->alink + (ulong)((*(uint *)fx68k & 1) << 4)) != uVar6) {
      pFVar9 = (FX *)NativeAligned4FromStackOffset(uVar6 - 10);
      incusecount68k(pFVar9);
    }
    decusecount68k(fx68k);
    if ((MachineState.pvar[-10] & 1) == 0) {
      LVar7 = LAddrFromNative(MachineState.pvar + -0xc);
      MachineState.pvar[-1] = (DLword)LVar7;
    }
    DVar5 = StackOffsetFromNative(SAddr);
    MachineState.pvar[-2] = DVar5 + 10;
    MachineState.pvar[-10] = (short)*(undefined4 *)(MachineState.pvar + -2) + 1;
  }
  return SAddr;
}

Assistant:

static FX *make_FXcopy(FX *fx68k) {
  int size;
  int nametbl_on_stk = NIL;
  DLword *new68k;
  Bframe *retbf68k;

#ifdef FLIPCURSOR
  flip_cursorbar(5);
#endif

  CHECK_FX(fx68k);
  size = FX_size(fx68k) + DLWORDSPER_CELL;
#ifdef BIGVM
  if (fx68k->validnametable && ((fx68k->nametable >> 16) == STK_HI))
#else
  if (fx68k->validnametable && (fx68k->hi2nametable == STK_HI))
#endif /* BIGVM */
  {
/* frame contains a name table, so we care that the alignment
 of the new block be same as old */
#ifdef STACKCHECK
    {
      DLword n;
#ifdef BIGVM
      n = fx68k->nametable & 0xFFFF;
#else
      n = fx68k->lonametable;
#endif /* BIGVM */
      if ((n <= StackOffsetFromNative(fx68k)) && (n >= fx68k->nextblock))
        error("hardreturn:nametable check");
    }
#endif
    nametbl_on_stk = T;
    /* Find a free stack block */
    new68k = freestackblock(size, (StackWord *)CURRENTFX,
                            (StackOffsetFromNative(fx68k) - DLWORDSPER_CELL) % DLWORDSPER_QUAD);
  } /*if end */
  else
    new68k = freestackblock(size, (StackWord *)CURRENTFX, -1); /* No align */

  if (new68k == 0) return (0); /* No more space for STACK */

  /* blt(dest,source,size) */
  blt(new68k, (((DLword *)fx68k) - DLWORDSPER_CELL), size);

  ((Bframe *)new68k)->residual = T;
  new68k = new68k + DLWORDSPER_CELL; /* now NEW points to the FX */
  ((FX *)new68k)->nextblock = (StackOffsetFromNative(new68k) + size) - DLWORDSPER_CELL;
  retbf68k = (Bframe *)NativeAligned4FromStackOffset(GETBLINK(fx68k));
  /* Set true BFptr,not the residual */
  SETBLINK(new68k, GETBLINK(fx68k));
  ((FX *)new68k)->usecount = 0;
  CHECK_BF(retbf68k);

#ifdef BIGVM
  if (nametbl_on_stk) ((FX *)new68k)->nametable += (((UNSIGNED)new68k - (UNSIGNED)fx68k) >> 1);
#else
  if (nametbl_on_stk) ((FX *)new68k)->lonametable += (((UNSIGNED)new68k - (UNSIGNED)fx68k) >> 1);
#endif
  /* increment use count of basic frame of returnee because
  we made another FX which points to it */
  retbf68k->usecnt++;
  SET_FASTP_NIL(fx68k);
  /* increment use count of CLINK of returnee
     because we made a copy of returnee */
  incusecount68k((FX *)NativeAligned4FromStackOffset(GETCLINK(fx68k)));

  if (GETCLINK(fx68k) != GETALINK(fx68k)) {
    incusecount68k((FX *)NativeAligned4FromStackOffset(GETALINK(fx68k)));
  }

  decusecount68k(fx68k); /* if usecon==0  -> FSB */
  SETACLINK(CURRENTFX, StackOffsetFromNative(new68k));
  CHECK_FX((FX *)new68k);
  CHECK_FX(CURRENTFX);
#ifdef STACKCHECK
  stack_check(0);
#endif
#ifdef FLIPCURSOR
  flip_cursorbar(5);
#endif

  return ((FX *)new68k);
}